

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O2

int insert_between(ll_head *q_head,ll_elem *n,ll_elem *p,ll_elem *s)

{
  elem_ptr_t *ptr;
  ulong uVar1;
  int iVar2;
  ll_head *plVar3;
  ll_head *q_head_00;
  size_t count;
  size_t count_00;
  size_t count_01;
  size_t count_02;
  size_t count_03;
  ll_elem *plVar4;
  ll_elem *plVar5;
  ll_elem *old;
  ll_head *local_50;
  ll_elem *local_48;
  ll_head *local_40;
  ll_elem *ps_;
  
  if (((ulong)q_head & 3) != 0) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1c7,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  local_48 = (ll_elem *)((ulong)n & 0xfffffffffffffffc);
  if (local_48 != n) {
    __assert_fail("n == ptr_clear(n)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1c8,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  plVar5 = (ll_elem *)((ulong)p & 0xfffffffffffffffc);
  if (plVar5 != p) {
    __assert_fail("p == ptr_clear(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1c9,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  plVar4 = (ll_elem *)((ulong)s & 0xfffffffffffffffc);
  if (plVar4 != s) {
    __assert_fail("s == ptr_clear(s)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1ca,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  if (3 < n->pred) {
    __assert_fail("ptr_clear((struct ll_elem*)atomic_load_explicit(&n->pred, memory_order_relaxed)) == NULL"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1cd
                  ,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  if (n->succ != 2) {
    __assert_fail("atomic_load_explicit(&n->succ, memory_order_relaxed) == FLAGGED",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1ce,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  if (n->refcnt == 0) {
    __assert_fail("atomic_load_explicit(&n->refcnt, memory_order_relaxed) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x1cf,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  ptr = &n->pred;
  do {
  } while (*ptr != 0);
  LOCK();
  plVar5->refcnt = plVar5->refcnt + 1;
  UNLOCK();
  LOCK();
  plVar4->refcnt = plVar4->refcnt + 1;
  UNLOCK();
  old = (ll_elem *)0x2;
  local_50 = (ll_head *)s;
  local_40 = q_head;
  iVar2 = ptr_cas(&n->succ,&old,(ll_elem *)((ulong)s | 2));
  if (iVar2 != 0) {
    ptr_clear_deref(&n->succ);
    old = (ll_elem *)0x0;
    iVar2 = ptr_cas(ptr,&old,p);
    if (iVar2 == 0) {
      __assert_fail("cas",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                    0x1e8,
                    "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                   );
    }
    ptr_clear_deref(ptr);
    plVar3 = (ll_head *)deref(&p->succ);
    if ((((ll_elem *)((ulong)plVar3 & 0xfffffffffffffffc) == plVar4) && ((plVar5->pred & 2) == 0))
       && (ps_ = (ll_elem *)plVar3, iVar2 = ptr_cas(&p->succ,&ps_,n), iVar2 != 0)) {
      if ((plVar5->pred & 2) == 0) {
        LOCK();
        local_48->refcnt = local_48->refcnt + 1;
        UNLOCK();
        ptr_clear_deref(&p->succ);
        deref_release(plVar3,(ll_elem *)0x2,count);
        plVar3 = local_40;
        q_head_00 = (ll_head *)pred(local_40,&local_50->q);
        deref_release(q_head_00,(ll_elem *)0x1,count_00);
        LOCK();
        plVar3->size = plVar3->size + 1;
        UNLOCK();
        LOCK();
        n->succ = n->succ & 0xfffffffffffffffd;
        UNLOCK();
        return 1;
      }
      LOCK();
      uVar1 = p->succ;
      p->succ = (elem_ptr_t)ps_;
      UNLOCK();
      if ((ll_elem *)(uVar1 & 0xfffffffffffffffc) != n) {
        __assert_fail("(tmp & ~(FLAGGED | DEREF)) == (uintptr_t)n",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x209,
                      "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                     );
      }
      if ((uVar1 & 1) == 0) {
        __assert_fail("tmp & DEREF",
                      "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                      0x20a,
                      "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                     );
      }
    }
    old = (ll_elem *)((ulong)s | 2);
    iVar2 = ptr_cas(&n->succ,&old,(ll_elem *)0x2);
    if (iVar2 == 0) {
      __assert_fail("cas",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                    0x223,
                    "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                   );
    }
    ptr_clear_deref(&n->succ);
    old = p;
    iVar2 = ptr_cas(ptr,&old,(ll_elem *)0x0);
    if (iVar2 != 0) {
      ptr_clear_deref(ptr);
      deref_release((ll_head *)p,(ll_elem *)0x1,count_01);
      deref_release(local_50,(ll_elem *)0x1,count_02);
      deref_release(plVar3,(ll_elem *)0x1,count_03);
      return 0;
    }
    __assert_fail("cas","/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                  0x229,
                  "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
                 );
  }
  __assert_fail("cas","/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                0x1e3,
                "int insert_between(struct ll_head *, struct ll_elem *, struct ll_elem *, struct ll_elem *)"
               );
}

Assistant:

static int
insert_between(struct ll_head *q_head, struct ll_elem *n,
    struct ll_elem *p, struct ll_elem *s)
{
	struct ll_elem	*q, *ps = NULL, *ps_, *old;
	int		 cas;

	q = &q_head->q;
	/* Check arguments. */
	assert(q == ptr_clear(q));
	assert(n == ptr_clear(n));
	assert(p == ptr_clear(p));
	assert(s == ptr_clear(s));
	/* Check initial state of n. */
	assert(ptr_clear((struct ll_elem*)atomic_load_explicit(&n->pred,
	    memory_order_relaxed)) == NULL);
	assert(atomic_load_explicit(&n->succ, memory_order_relaxed) == FLAGGED);
	assert(atomic_load_explicit(&n->refcnt, memory_order_relaxed) > 0);
	/*
	 * Give unlink_release() time to update n->pred.
	 * XXX try and make this an aid function?
	 */
	while (atomic_load_explicit(&n->pred, memory_order_relaxed) != 0)
		SPINWAIT();

	/*
	 * Assign n->pred, n->succ.
	 *
	 * We add a flag to s, to prevent deletion operations from starting
	 * before we are ready.
	 */
	deref_acquire(p, 1);	/* Because n->pred = p. */
	deref_acquire(s, 1);	/* Because n->succ = s. */

	old = (struct ll_elem*)FLAGGED;
	cas = ptr_cas(&n->succ, &old,
	    (struct ll_elem*)((uintptr_t)s | FLAGGED));
	assert(cas);
	ptr_clear_deref(&n->succ);

	old = NULL;
	cas = ptr_cas(&n->pred, &old, p);
	assert(cas);
	ptr_clear_deref(&n->pred);

	/* Load bits in p->succ. */
	ps = deref(&p->succ);
	if (ptr_clear(ps) != ptr_clear(s) || deleted(p))
		goto fail;

	/* Exchange p->succ from s to n. */
	ps_ = ps;
	if (!ptr_cas(&p->succ, &ps_, n))
		goto fail;
	/*
	 * If p is not deleted at this moment, the link is succesful
	 * (since a non-deleted p means p is reachable from q and
	 * our update changed n to be reachable from p,
	 * hence it's reachable from q).
	 *
	 * Note that we hold the DEREF on ps->succ, so it cannot change.
	 *
	 * Also, note that we do not care if s has the deleted bit set:
	 * if it is being deleted, its deletor would have to update
	 * p->succ as well; we simply won the race to do that.
	 */
	if (deleted(p)) {
		uintptr_t	 tmp;

		/*
		 * Restore old value, note that this operation also clears
		 * the deref bit, since ps_ will not have that set.
		 */
		tmp = atomic_exchange_explicit(&p->succ, (uintptr_t)ps_,
		    memory_order_release);
		assert((tmp & ~(FLAGGED | DEREF)) == (uintptr_t)n);
		assert(tmp & DEREF);
		goto fail;
	}

	/* Update succesful.  Update deref counter on n and release p->succ. */
	deref_acquire(n, 1);
	ptr_clear_deref(&p->succ);
	/* Forget ps. */
	deref_release(q_head, ps, 2);	/* Once for ps, once for p->succ. */
	ps = NULL;

	/* Fix pred pointer of s. */
	deref_release(q_head, pred(q_head, s), 1);

	/* Update list size. */
	atomic_fetch_add_explicit(&q_head->size, 1, memory_order_relaxed);
	/* Clear delete block. */
	atomic_fetch_and_explicit(&n->succ, ~FLAGGED, memory_order_release);

	return 1;

fail:
	/* Undo setting n->succ. */
	old = (struct ll_elem*)((uintptr_t)s | FLAGGED);
	cas = ptr_cas(&n->succ, &old, (struct ll_elem*)FLAGGED);
	assert(cas);
	ptr_clear_deref(&n->succ);

	/* Undo setting n->pred. */
	old = p;
	cas = ptr_cas(&n->pred, &old, NULL);
	assert(cas);
	ptr_clear_deref(&n->pred);

	deref_release(q_head, p, 1);
	deref_release(q_head, s, 1);
	deref_release(q_head, ps, 1);
	return 0;
}